

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_domain.c
# Opt level: O1

int nhdp_domain_mpr_add(nhdp_domain_mpr *mpr)

{
  list_entity **pplVar1;
  int iVar2;
  int iVar3;
  list_entity *plVar4;
  
  (mpr->_node).key = mpr->name;
  iVar2 = avl_insert(&_domain_mprs,&mpr->_node);
  iVar3 = -1;
  if (iVar2 == 0) {
    plVar4 = _domain_list.next;
    if ((_domain_list.next)->prev != _domain_list.prev) {
      do {
        if ((nhdp_domain_mpr *)plVar4[-0x28].prev == &_everyone_mprs) {
          _apply_mpr((nhdp_domain *)(plVar4 + -0x2a),(char *)(plVar4 + -0x29),
                     *(uint8_t *)&plVar4[-0x27].next);
        }
        pplVar1 = &plVar4->next;
        plVar4 = *pplVar1;
      } while ((*pplVar1)->prev != _domain_list.prev);
    }
    iVar3 = 0;
    if (_flooding_domain.mpr == &_everyone_mprs) {
      _apply_mpr(&_flooding_domain,_flooding_domain.mpr_name,_flooding_domain.local_willingness);
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
nhdp_domain_mpr_add(struct nhdp_domain_mpr *mpr) {
  struct nhdp_domain *domain;

  /* initialize key */
  mpr->_node.key = mpr->name;

  if (avl_insert(&_domain_mprs, &mpr->_node)) {
    return -1;
  }

  list_for_each_element(&_domain_list, domain, _node) {
    if (domain->mpr == &_everyone_mprs) {
      _apply_mpr(domain, domain->mpr_name, domain->local_willingness);
    }
  }
  if (_flooding_domain.mpr == &_everyone_mprs) {
    _apply_mpr(&_flooding_domain, _flooding_domain.mpr_name, _flooding_domain.local_willingness);
  }
  return 0;
}